

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O2

void __thiscall QSyntaxHighlighter::setDocument(QSyntaxHighlighter *this,QTextDocument *doc)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QTextLayout *this_01;
  QTextDocument *document;
  char *pcVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QTextCursor cursor;
  Connection aCStack_68 [8];
  QTextCursor local_60;
  QTextBlock local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x78);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    if ((this_00->d == (Data *)0x0) ||
       ((this_00->d->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)(lVar1 + 0x80);
    }
    QObject::disconnect(pQVar4,"2contentsChange(int,int,int)",(QObject *)this,
                        "1_q_reformatBlocks(int,int,int)");
    local_60.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    if ((this_00->d == (Data *)0x0) ||
       ((this_00->d->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      document = (QTextDocument *)0x0;
    }
    else {
      document = *(QTextDocument **)(lVar1 + 0x80);
    }
    QTextCursor::QTextCursor(&local_60,document);
    QTextCursor::beginEditBlock(&local_60);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::begin((QTextDocument *)local_48);
    while( true ) {
      bVar2 = QTextBlock::isValid((QTextBlock *)local_48);
      if (!bVar2) break;
      this_01 = QTextBlock::layout((QTextBlock *)local_48);
      QTextLayout::clearFormats(this_01);
      QTextBlock::next(&local_58);
      local_48._0_8_ = local_58.p;
      local_48._8_4_ = local_58.n;
    }
    QTextCursor::endEditBlock(&local_60);
    QTextCursor::~QTextCursor(&local_60);
  }
  QWeakPointer<QObject>::assign<QObject>(this_00,&doc->super_QObject);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    if ((this_00->d == (Data *)0x0) ||
       ((this_00->d->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = *(char **)(lVar1 + 0x80);
    }
    QObject::connect((QObject *)aCStack_68,pcVar3,(QObject *)"2contentsChange(int,int,int)",
                     (char *)this,0x5f9cbd);
    QMetaObject::Connection::~Connection(aCStack_68);
    bVar2 = QTextDocument::isEmpty(*(QTextDocument **)(lVar1 + 0x80));
    if (!bVar2) {
      *(undefined1 *)(lVar1 + 0xb0) = 1;
      QTimer::singleShot((nanoseconds)0x0,&this->super_QObject,"1_q_delayedRehighlight()");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::setDocument(QTextDocument *doc)
{
    Q_D(QSyntaxHighlighter);
    if (d->doc) {
        disconnect(d->doc, SIGNAL(contentsChange(int,int,int)),
                   this, SLOT(_q_reformatBlocks(int,int,int)));

        QTextCursor cursor(d->doc);
        cursor.beginEditBlock();
        for (QTextBlock blk = d->doc->begin(); blk.isValid(); blk = blk.next())
            blk.layout()->clearFormats();
        cursor.endEditBlock();
    }
    d->doc = doc;
    if (d->doc) {
        connect(d->doc, SIGNAL(contentsChange(int,int,int)),
                this, SLOT(_q_reformatBlocks(int,int,int)));
        if (!d->doc->isEmpty()) {
            d->rehighlightPending = true;
            QTimer::singleShot(0, this, SLOT(_q_delayedRehighlight()));
        }
    }
}